

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<true,_true,_false>::delete_key(DaTrie<true,_true,_false> *this,Query *query)

{
  bool bVar1;
  uint32_t uVar2;
  DaTrie<true,_true,_false> *pDVar3;
  DaTrie<true,_true,_false> *pDVar4;
  reference pvVar5;
  Query *in_RSI;
  DaTrie<true,_true,_false> *in_RDI;
  uint32_t parent_pos;
  uint32_t tail_pos;
  Query *in_stack_000000e8;
  DaTrie<true,_true,_false> *in_stack_000000f0;
  undefined8 in_stack_ffffffffffffff48;
  uint32_t node_pos;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff7c;
  DaTrie<true,_true,_false> *in_stack_ffffffffffffff80;
  DaTrie<true,_true,_false> *in_stack_ffffffffffffff88;
  bool local_1;
  
  node_pos = (uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  uVar2 = Query::node_pos(in_RSI);
  pDVar3 = (DaTrie<true,_true,_false> *)(ulong)uVar2;
  pDVar4 = (DaTrie<true,_true,_false> *)
           std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(&in_RDI->bc_);
  if (pDVar4 <= pDVar3) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x6b,
                  "bool ddd::DaTrie<true, true, false>::delete_key(Query &) [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  uVar2 = Query::node_pos(in_RSI);
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
  bVar1 = Bc::is_fixed(pvVar5);
  if (!bVar1) {
    __assert_fail("bc_[query.node_pos()].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x6c,
                  "bool ddd::DaTrie<true, true, false>::delete_key(Query &) [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  bVar1 = search_key(in_stack_ffffffffffffff88,(Query *)in_stack_ffffffffffffff80);
  if (bVar1) {
    uVar2 = Query::node_pos(in_RSI);
    if (uVar2 == 0) {
      pDVar3 = (DaTrie<true,_true,_false> *)&stack0xffffffffffffff78;
      DaTrie(in_RDI);
      swap(in_RDI,pDVar3);
      ~DaTrie(in_RDI);
      local_1 = true;
    }
    else {
      Query::node_pos(in_RSI);
      delete_sib_(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      Query::node_pos(in_RSI);
      bVar1 = is_terminal_(pDVar3,(uint32_t)((ulong)in_RDI >> 0x20));
      if (!bVar1) {
        uVar2 = Query::node_pos(in_RSI);
        pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           (&in_RDI->bc_,(ulong)uVar2);
        Bc::value(pvVar5);
        std::vector<char,_std::allocator<char>_>::data
                  ((vector<char,_std::allocator<char>_> *)0x177a7c);
        uVar2 = utils::length((char *)0x177a8b);
        in_RDI->tail_emps_ = in_RDI->tail_emps_ + uVar2 + 4;
      }
      uVar2 = Query::node_pos(in_RSI);
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2)
      ;
      Bc::check(pvVar5);
      Query::node_pos(in_RSI);
      unfix_(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
      Query::prev((Query *)in_RDI,node_pos);
      change_branch_(in_stack_000000f0,in_stack_000000e8);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool delete_key(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    if (!search_key(query)) {
      return false;
    }

    if (query.node_pos() == ROOT_POS) {
      DaTrie().swap(*this);
      return true;
    }

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    if (!is_terminal_(query.node_pos())) {
      auto tail_pos = bc_[query.node_pos()].value();
      tail_emps_ += utils::length(tail_.data() + tail_pos) + sizeof(uint32_t);
    }

    auto parent_pos = bc_[query.node_pos()].check();
    unfix_(query.node_pos(), blocks_);
    query.prev(parent_pos);

    change_branch_(query);
    return true;
  }